

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O1

SmallBuffer * __thiscall
helics::JsonTranslatorOperator::convertToValue
          (SmallBuffer *__return_storage_ptr__,JsonTranslatorOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  Message *pMVar1;
  defV val;
  _Variadic_union<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_90;
  undefined1 local_68;
  anon_class_8_1_8991fb9c local_60;
  size_t local_58;
  byte *local_50;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_38;
  
  local_90._M_first._M_storage = (_Uninitialized<double,_true>)0.0;
  local_68 = 0;
  pMVar1 = (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  local_58 = (pMVar1->data).bufferSize;
  local_50 = (pMVar1->data).heap;
  local_48 = 0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  readJsonValue_abi_cxx11_((defV *)&local_38,(helics *)&local_58,(data_view *)message);
  local_60.this =
       (_Move_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        *)&local_90;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_&>
    ::_S_vtable._M_arr[(long)(char)local_38._M_index + 1]._M_data)
            (&local_60,
             (variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
              *)&local_38);
  std::__detail::__variant::
  _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::~_Variant_storage(&local_38);
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  typeConvertDefV(__return_storage_ptr__,(defV *)&local_90._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                       *)&local_90._M_first);
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer JsonTranslatorOperator::convertToValue(std::unique_ptr<Message> message)
{
    defV val;
    val = readJsonValue(message->data.to_string());
    return typeConvertDefV(val);
}